

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr.c
# Opt level: O0

uint32_t raplcap_get_num_packages(raplcap *rc)

{
  int iVar1;
  uint32_t local_2c;
  uint32_t local_28;
  uint32_t local_24;
  uint32_t n_die;
  uint32_t n_pkg;
  raplcap_msr_sys_ctx *sys;
  raplcap_msr *state;
  raplcap *rc_local;
  
  state = (raplcap_msr *)rc;
  if (rc == (raplcap *)0x0) {
    state = (raplcap_msr *)&rc_default;
  }
  sys = (raplcap_msr_sys_ctx *)(state->ctx).power_units;
  if (sys == (raplcap_msr_sys_ctx *)0x0) {
    _n_die = (raplcap_msr_sys_ctx *)0x0;
  }
  else {
    _n_die = *(raplcap_msr_sys_ctx **)&sys[2].n_fds;
  }
  iVar1 = msr_sys_get_num_pkg_die(_n_die,&local_24,&local_28);
  if (iVar1 == 0) {
    local_2c = local_24;
  }
  else {
    local_2c = 0;
  }
  return local_2c;
}

Assistant:

uint32_t raplcap_get_num_packages(const raplcap* rc) {
  const raplcap_msr* state;
  const raplcap_msr_sys_ctx* sys;
  uint32_t n_pkg;
  uint32_t n_die;
  if (rc == NULL) {
    rc = &rc_default;
  }
  if ((state = (raplcap_msr*) rc->state) != NULL) {
    sys = state->sys;
  } else {
    sys = NULL;
  }
  return msr_sys_get_num_pkg_die(sys, &n_pkg, &n_die) ? 0 : n_pkg;
}